

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O3

void remora::bindings::ugemm<remora::bindings::gemm_block_size<double>,double,double>
               (size_t kc,double alpha,double *A,double *B,double *C,size_t stride1,size_t stride2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  size_t sVar4;
  undefined1 *puVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  type Pa;
  undefined1 local_140 [272];
  
  memset(local_140,0,0xc0);
  if (kc != 0) {
    sVar4 = 0;
    do {
      lVar6 = 0;
      puVar5 = local_140;
      do {
        dVar1 = A[lVar6];
        lVar8 = 0;
        do {
          dVar3 = (B + lVar8)[1];
          dVar2 = *(double *)((long)(puVar5 + lVar8 * 8) + 8);
          *(double *)(puVar5 + lVar8 * 8) = B[lVar8] * dVar1 + *(double *)(puVar5 + lVar8 * 8);
          *(double *)((long)(puVar5 + lVar8 * 8) + 8) = dVar3 * dVar1 + dVar2;
          lVar8 = lVar8 + 2;
        } while (lVar8 != 6);
        lVar6 = lVar6 + 1;
        puVar5 = puVar5 + 0x30;
      } while (lVar6 != 4);
      A = A + 4;
      B = B + 6;
      sVar4 = sVar4 + 1;
    } while (sVar4 != kc);
  }
  if ((alpha != 1.0) || (NAN(alpha))) {
    puVar5 = local_140;
    lVar6 = 0;
    do {
      lVar8 = 0;
      do {
        dVar1 = *(double *)((long)(puVar5 + lVar8 * 8) + 8);
        *(double *)(puVar5 + lVar8 * 8) = *(double *)(puVar5 + lVar8 * 8) * alpha;
        *(double *)((long)(puVar5 + lVar8 * 8) + 8) = dVar1 * alpha;
        lVar8 = lVar8 + 2;
      } while (lVar8 != 6);
      lVar6 = lVar6 + 1;
      puVar5 = puVar5 + 0x30;
    } while (lVar6 != 4);
  }
  puVar5 = local_140;
  lVar6 = 0;
  do {
    lVar8 = 0;
    pdVar7 = C;
    do {
      *pdVar7 = *(double *)(puVar5 + lVar8 * 8) + *pdVar7;
      lVar8 = lVar8 + 1;
      pdVar7 = pdVar7 + stride2;
    } while (lVar8 != 6);
    lVar6 = lVar6 + 1;
    C = C + stride1;
    puVar5 = puVar5 + 0x30;
  } while (lVar6 != 4);
  return;
}

Assistant:

void ugemm(
	std::size_t kc, TC alpha, T const* A, T const* B,
	TC* C, std::size_t stride1, std::size_t stride2
){
	BOOST_ALIGN_ASSUME_ALIGNED(A, block_size::block::align);
	BOOST_ALIGN_ASSUME_ALIGNED(B, block_size::block::align);

	typedef typename block_size::block::type vx;
	static const std::size_t vector_length = block_size::block::vector_elements;
	static const std::size_t vecNR = block_size::nr/vector_length;
#ifdef REMORA_USE_SIMD
	vx P[block_size::mr * vecNR] = {};
#else
	typename std::aligned_storage<sizeof(vx[block_size::mr*vecNR]),block_size::block::align>::type Pa;
	T* P = reinterpret_cast<T*>(&Pa);
	for (std::size_t c = 0; c < block_size::mr*vecNR; c++)
		P[c] = 0;
#endif


	// perform the matrix-matrix product as outer product
	// of rows of A and B
	vx const* b = (vx const*)B;
	for (std::size_t l=0; l<kc; ++l) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j<vecNR; ++j) {
				P[i * vecNR+j] += A[i]*b[j];
			}
		}
		A += block_size::mr;
		b += vecNR;
	}
	//multiply with alpha if necessary
	if (alpha!=TC(1)) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j< vecNR; ++j) {
				P[i*vecNR+j] *= alpha;
			}
		}
	}

	//add result to C
	T const* p = (T const*) P;
	for (std::size_t i=0; i<block_size::mr; ++i) {
		for (std::size_t j=0; j<block_size::nr; ++j) {
			C[i * stride1+j * stride2] += p[i*block_size::nr+j];
		}
	}
}